

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

_Bool ext_ml_model_decision_after_split
                (AV1_COMP *cpi,float *features_terminate,int *terminate_partition_search)

{
  _Bool _Var1;
  int iVar2;
  undefined4 *in_RDX;
  long in_RSI;
  long in_RDI;
  _Bool valid_decision;
  aom_partition_decision_t decision;
  int i;
  aom_partition_features_t features;
  ExtPartController *ext_part_controller;
  AV1_COMMON *cm;
  aom_partition_decision_t *in_stack_ffffffffffffd490;
  ExtPartController *in_stack_ffffffffffffd498;
  undefined4 local_b64;
  int local_b2c;
  undefined4 auStack_9fc [627];
  long local_30;
  AV1_COMMON *local_28;
  undefined4 *local_20;
  long local_18;
  long local_10;
  _Bool local_1;
  
  local_28 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_30 = in_RDI + 0x9d528;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = frame_is_intra_only(local_28);
  if ((iVar2 == 0) && (*(int *)(local_10 + 0x9d528) != 0)) {
    for (local_b2c = 0; local_b2c < 0x1f; local_b2c = local_b2c + 1) {
      auStack_9fc[local_b2c] = *(undefined4 *)(local_18 + (long)local_b2c * 4);
    }
    av1_ext_part_send_features
              (in_stack_ffffffffffffd498,(aom_partition_features_t *)in_stack_ffffffffffffd490);
    _Var1 = av1_ext_part_get_partition_decision(in_stack_ffffffffffffd498,in_stack_ffffffffffffd490)
    ;
    if (_Var1) {
      *local_20 = local_b64;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ext_ml_model_decision_after_split(AV1_COMP *const cpi,
                                       const float *const features_terminate,
                                       int *terminate_partition_search) {
  const AV1_COMMON *const cm = &cpi->common;
  ExtPartController *const ext_part_controller = &cpi->ext_part_controller;
  if (frame_is_intra_only(cm) || !cpi->ext_part_controller.ready) {
    return false;
  }

  // Setup features.
  aom_partition_features_t features;
  features.id = AOM_EXT_PART_FEATURE_AFTER_SPLIT;
  for (int i = 0; i < 31; ++i) {
    features.after_part_split.f_terminate[i] = features_terminate[i];
  }

  // Send necessary features to the external model.
  av1_ext_part_send_features(ext_part_controller, &features);

  // Get partition decisions from the external model.
  aom_partition_decision_t decision;
  const bool valid_decision =
      av1_ext_part_get_partition_decision(ext_part_controller, &decision);
  if (!valid_decision) return false;

  // Populate decisions
  *terminate_partition_search = decision.terminate_partition_search;

  return true;
}